

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

FileMetaData *
leveldb::FindSmallestBoundaryFile
          (InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files,
          InternalKey *largest_key)

{
  value_type pFVar1;
  int iVar2;
  Comparator *pCVar3;
  InternalKey *pIVar4;
  const_reference ppFVar5;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *in_RSI;
  InternalKeyComparator *in_RDI;
  bool bVar6;
  FileMetaData *f;
  size_t i;
  FileMetaData *smallest_boundary_file;
  Comparator *user_cmp;
  InternalKey *this;
  undefined1 local_58 [8];
  InternalKey *b;
  Slice in_stack_ffffffffffffffb8;
  InternalKey *local_30;
  value_type local_28;
  
  pCVar3 = InternalKeyComparator::user_comparator(in_RDI);
  local_28 = (value_type)0x0;
  local_30 = (InternalKey *)0x0;
  while (this = local_30,
        pIVar4 = (InternalKey *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(in_RSI), this < pIVar4) {
    ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](in_RSI,(size_type)local_30);
    pFVar1 = *ppFVar5;
    iVar2 = InternalKeyComparator::Compare
                      ((InternalKeyComparator *)in_stack_ffffffffffffffb8.size_,
                       (InternalKey *)in_stack_ffffffffffffffb8.data_,b);
    bVar6 = false;
    if (0 < iVar2) {
      in_stack_ffffffffffffffb8 = InternalKey::user_key(this);
      _local_58 = InternalKey::user_key(this);
      iVar2 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&stack0xffffffffffffffb8,local_58);
      bVar6 = iVar2 == 0;
    }
    if ((bVar6) &&
       ((local_28 == (value_type)0x0 ||
        (iVar2 = InternalKeyComparator::Compare
                           ((InternalKeyComparator *)in_stack_ffffffffffffffb8.size_,
                            (InternalKey *)in_stack_ffffffffffffffb8.data_,b), iVar2 < 0)))) {
      local_28 = pFVar1;
    }
    local_30 = (InternalKey *)&(local_30->rep_).field_0x1;
  }
  return local_28;
}

Assistant:

FileMetaData* FindSmallestBoundaryFile(
    const InternalKeyComparator& icmp,
    const std::vector<FileMetaData*>& level_files,
    const InternalKey& largest_key) {
  const Comparator* user_cmp = icmp.user_comparator();
  FileMetaData* smallest_boundary_file = nullptr;
  for (size_t i = 0; i < level_files.size(); ++i) {
    FileMetaData* f = level_files[i];
    if (icmp.Compare(f->smallest, largest_key) > 0 &&
        user_cmp->Compare(f->smallest.user_key(), largest_key.user_key()) ==
            0) {
      if (smallest_boundary_file == nullptr ||
          icmp.Compare(f->smallest, smallest_boundary_file->smallest) < 0) {
        smallest_boundary_file = f;
      }
    }
  }
  return smallest_boundary_file;
}